

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_estimateCDictSize(size_t dictSize,int compressionLevel)

{
  ZSTD_compressionParameters cParams_00;
  size_t sVar1;
  ZSTD_compressionParameters cParams;
  
  ZSTD_getCParams_internal
            (&cParams,compressionLevel,0xffffffffffffffff,dictSize,ZSTD_cpm_createCDict);
  cParams_00.hashLog = cParams.hashLog;
  cParams_00.windowLog = cParams.windowLog;
  cParams_00.chainLog = cParams.chainLog;
  cParams_00.searchLog = cParams.searchLog;
  cParams_00.minMatch = cParams.minMatch;
  cParams_00.targetLength = cParams.targetLength;
  cParams_00.strategy = cParams.strategy;
  sVar1 = ZSTD_estimateCDictSize_advanced(dictSize,cParams_00,ZSTD_dlm_byCopy);
  return sVar1;
}

Assistant:

size_t ZSTD_estimateCDictSize(size_t dictSize, int compressionLevel)
{
    ZSTD_compressionParameters const cParams = ZSTD_getCParams_internal(compressionLevel, ZSTD_CONTENTSIZE_UNKNOWN, dictSize, ZSTD_cpm_createCDict);
    return ZSTD_estimateCDictSize_advanced(dictSize, cParams, ZSTD_dlm_byCopy);
}